

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

stat * tree_current_stat(tree *t)

{
  wchar_t __fd;
  int iVar1;
  char *__file;
  tree *in_RDI;
  
  if ((in_RDI->flags & 0x10U) == 0) {
    __fd = tree_current_dir_fd(in_RDI);
    __file = tree_current_access_path(in_RDI);
    iVar1 = fstatat(__fd,__file,(stat *)&in_RDI->st,0);
    if (iVar1 != 0) {
      return (stat *)0x0;
    }
    in_RDI->flags = in_RDI->flags | 0x10;
  }
  return &in_RDI->st;
}

Assistant:

static const struct stat *
tree_current_stat(struct tree *t)
{
	if (!(t->flags & hasStat)) {
#ifdef HAVE_FSTATAT
		if (fstatat(tree_current_dir_fd(t),
		    tree_current_access_path(t), &t->st, 0) != 0)
#else
		if (tree_enter_working_dir(t) != 0)
			return NULL;
		if (stat(tree_current_access_path(t), &t->st) != 0)
#endif
			return NULL;
		t->flags |= hasStat;
	}
	return (&t->st);
}